

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

bool duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::TryGetNextFile
               (MultiFileGlobalState *global_state,unique_lock<std::mutex> *parallel_lock)

{
  char cVar1;
  OpenFileInfo scanned_file;
  unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
  uStack_48;
  OpenFileInfo local_40;
  
  local_40.path._M_dataplus._M_p = (pointer)&local_40.path.field_2;
  local_40.path._M_string_length = 0;
  local_40.path.field_2._M_local_buf[0] = '\0';
  local_40.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar1 = duckdb::MultiFileList::Scan
                    ((MultiFileListScanData *)global_state->file_list,
                     (OpenFileInfo *)&global_state->file_list_scan);
  if (cVar1 != '\0') {
    make_uniq<duckdb::MultiFileReaderData,duckdb::OpenFileInfo&>((duckdb *)&uStack_48,&local_40);
    std::
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
              ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                *)&global_state->readers,
               (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                *)&uStack_48);
    std::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
    ::~unique_ptr(&uStack_48);
  }
  OpenFileInfo::~OpenFileInfo(&local_40);
  return (bool)cVar1;
}

Assistant:

static bool TryGetNextFile(MultiFileGlobalState &global_state, unique_lock<mutex> &parallel_lock) {
		D_ASSERT(parallel_lock.owns_lock());
		OpenFileInfo scanned_file;
		if (!global_state.file_list.Scan(global_state.file_list_scan, scanned_file)) {
			return false;
		}

		// Push the file in the reader data, to be opened later
		global_state.readers.push_back(make_uniq<MultiFileReaderData>(scanned_file));

		return true;
	}